

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

SliceStaticLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_slicestatic(NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  SliceStaticLayerParams *pSVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_slicestatic(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_slicestatic(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pSVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::SliceStaticLayerParams>(arena);
    (this->layer_).slicestatic_ = pSVar2;
  }
  return (SliceStaticLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::SliceStaticLayerParams* NeuralNetworkLayer::_internal_mutable_slicestatic() {
  if (!_internal_has_slicestatic()) {
    clear_layer();
    set_has_slicestatic();
    layer_.slicestatic_ = CreateMaybeMessage< ::CoreML::Specification::SliceStaticLayerParams >(GetArenaForAllocation());
  }
  return layer_.slicestatic_;
}